

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::hugeint_t,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  hugeint_t input;
  hugeint_t input_00;
  RESULT_TYPE RVar1;
  hugeint_t hVar2;
  hugeint_t hi;
  hugeint_t lo;
  unsigned_long local_48;
  unsigned_long local_40;
  hugeint_t local_38;
  hugeint_t local_28;
  
  local_48 = lidx;
  local_40 = hidx;
  if (lidx == hidx) {
    RVar1 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_48);
    input.upper = RVar1.upper;
    input.lower = input.upper;
    hVar2 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar1.lower,input);
  }
  else {
    RVar1 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_48);
    hVar2.upper = RVar1.upper;
    hVar2.lower = hVar2.upper;
    local_28 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar1.lower,hVar2);
    RVar1 = QuantileIndirect<duckdb::hugeint_t>::operator()(accessor,&local_40);
    input_00.upper = RVar1.upper;
    input_00.lower = input_00.upper;
    local_38 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar1.lower,input_00);
    hVar2 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                      ((CastInterpolation *)&local_28,&local_38,
                       this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                       (hugeint_t *)local_38.upper);
  }
  return hVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}